

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O1

QDebug __thiscall QVariant::qdebugHelper(QVariant *this,QDebug dbg)

{
  Stream *pSVar1;
  char16_t *pcVar2;
  _func_int **pp_Var3;
  DataPointer *pDVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  QString *pQVar8;
  storage_type *in_RCX;
  QDebug *in_RDX;
  long lVar9;
  QDebug rhs;
  QString *this_00;
  QMetaTypeInterface *iface;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QByteArrayView ba_02;
  QDebugStateSaver saver;
  QDebugStateSaver local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_50,in_RDX);
  iface = (QMetaTypeInterface *)((ulong)((dbg.stream)->buffer).d.ptr & 0xfffffffffffffffc);
  if (iface == (QMetaTypeInterface *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = (iface->typeId)._q_value.super___atomic_base<int>._M_i;
    if (iVar6 == 0) {
      iVar6 = QMetaType::registerHelper(iface);
    }
  }
  pSVar1 = in_RDX->stream;
  pSVar1->space = false;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QVariant(";
  QString::fromUtf8(&local_48,(QString *)0x9,ba);
  ::QTextStream::operator<<(&pSVar1->ts,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (in_RDX->stream->space == true) {
    ::QTextStream::operator<<(&in_RDX->stream->ts,' ');
  }
  if (iVar6 == 0) {
    pSVar1 = in_RDX->stream;
    ba_00.m_data = in_RCX;
    ba_00.m_size = (qsizetype)"Invalid";
    QString::fromUtf8(&local_48,(QString *)&DAT_00000007,ba_00);
    ::QTextStream::operator<<(&pSVar1->ts,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (in_RDX->stream->space == true) {
      ::QTextStream::operator<<(&in_RDX->stream->ts,' ');
    }
  }
  else {
    uVar7 = (ulong)((dbg.stream)->buffer).d.ptr & 0xfffffffffffffffc;
    if (uVar7 == 0) {
      lVar9 = 0;
    }
    else {
      lVar9 = *(long *)(uVar7 + 0x18);
    }
    if (lVar9 == 0) {
      this_00 = (QString *)0x0;
    }
    else {
      pQVar8 = (QString *)0xffffffffffffffff;
      do {
        this_00 = (QString *)((long)&(pQVar8->d).d + 1);
        pDVar4 = &pQVar8->d;
        pQVar8 = this_00;
      } while (*(char *)((long)&pDVar4->d + lVar9 + 1) != '\0');
    }
    pSVar1 = in_RDX->stream;
    ba_01.m_data = in_RCX;
    ba_01.m_size = lVar9;
    QString::fromUtf8(&local_48,this_00,ba_01);
    ::QTextStream::operator<<(&pSVar1->ts,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (in_RDX->stream->space == true) {
      ::QTextStream::operator<<(&in_RDX->stream->ts,' ');
    }
    pSVar1 = in_RDX->stream;
    ba_02.m_data = in_RCX;
    ba_02.m_size = (qsizetype)", ";
    QString::fromUtf8(&local_48,(QString *)0x2,ba_02);
    ::QTextStream::operator<<(&pSVar1->ts,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (in_RDX->stream->space == true) {
      ::QTextStream::operator<<(&in_RDX->stream->ts,' ');
    }
    pcVar2 = ((dbg.stream)->buffer).d.ptr;
    local_48.d.d = (Data *)((ulong)pcVar2 & 0xfffffffffffffffc);
    rhs.stream = dbg.stream;
    if (((ulong)pcVar2 & 1) != 0) {
      pp_Var3 = ((dbg.stream)->ts)._vptr_QTextStream;
      rhs.stream = (Stream *)((long)*(int *)((long)pp_Var3 + 4) + (long)pp_Var3);
    }
    bVar5 = QMetaType::debugStream((QMetaType *)&local_48,in_RDX,rhs.stream);
    if ((!bVar5) &&
       (bVar5 = QMetaType::canConvert
                          ((QMetaTypeInterface *)
                           ((ulong)((dbg.stream)->buffer).d.ptr & 0xfffffffffffffffc),
                           (QMetaType)&QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType),
       bVar5)) {
      toString(&local_48,(QVariant *)dbg.stream);
      if ((QChar *)local_48.d.ptr == (QChar *)0x0) {
        local_48.d.ptr = L"";
      }
      QDebug::putString(in_RDX,(QChar *)local_48.d.ptr,local_48.d.size);
      if (in_RDX->stream->space == true) {
        ::QTextStream::operator<<(&in_RDX->stream->ts,' ');
      }
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  ::QTextStream::operator<<(&in_RDX->stream->ts,')');
  if (in_RDX->stream->space == true) {
    ::QTextStream::operator<<(&in_RDX->stream->ts,' ');
  }
  pSVar1 = in_RDX->stream;
  in_RDX->stream = (Stream *)0x0;
  (this->d).data.shared = (PrivateShared *)pSVar1;
  QDebugStateSaver::~QDebugStateSaver(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

QDebug QVariant::qdebugHelper(QDebug dbg) const
{
    QDebugStateSaver saver(dbg);
    const uint typeId = d.type().id();
    dbg.nospace() << "QVariant(";
    if (typeId != QMetaType::UnknownType) {
        dbg << d.type().name() << ", ";
        bool streamed = d.type().debugStream(dbg, d.storage());
        if (!streamed && canConvert<QString>())
            dbg << toString();
    } else {
        dbg << "Invalid";
    }
    dbg << ')';
    return dbg;
}